

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

NaVector * __thiscall NaVector::add(NaVector *this,NaVector *rVect)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  iVar2 = (*rVect->_vptr_NaVector[6])(rVect);
  if (iVar1 == iVar2) {
    uVar5 = 0;
    while( true ) {
      uVar3 = (*this->_vptr_NaVector[6])(this);
      if (uVar3 <= uVar5) break;
      this->pVect[uVar5] = rVect->pVect[uVar5] + this->pVect[uVar5];
      uVar5 = uVar5 + 1;
    }
    return this;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 2;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

NaVector&
NaVector::add (const NaVector& rVect)
{
    if(dim() != rVect.dim())
        throw(na_size_mismatch);

    unsigned    i;
    for(i = 0; i < dim(); ++i)
        pVect[i] += rVect.pVect[i];

    return *this;
}